

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

int Cnf_IsopWriteCube(int Cube,int nVars,int *pVars,int *pLiterals)

{
  int local_28;
  int local_24;
  int b;
  int nLits;
  int *pLiterals_local;
  int *pVars_local;
  int nVars_local;
  int Cube_local;
  
  local_24 = nVars;
  _b = pLiterals;
  pVars_local._4_4_ = Cube;
  for (local_28 = 0; local_28 < nVars; local_28 = local_28 + 1) {
    if ((pVars_local._4_4_ & 3) == 1) {
      *_b = pVars[local_28] << 1;
      _b = _b + 1;
    }
    else if ((pVars_local._4_4_ & 3) == 2) {
      *_b = pVars[local_28] * 2 + 1;
      _b = _b + 1;
    }
    else {
      local_24 = local_24 + -1;
    }
    pVars_local._4_4_ = (int)pVars_local._4_4_ >> 2;
  }
  return local_24;
}

Assistant:

int Cnf_IsopWriteCube( int Cube, int nVars, int * pVars, int * pLiterals )
{
    int nLits = nVars, b;
    for ( b = 0; b < nVars; b++ )
    {
        if ( (Cube & 3) == 1 ) // value 0 --> write positive literal
            *pLiterals++ = 2 * pVars[b];
        else if ( (Cube & 3) == 2 ) // value 1 --> write negative literal
            *pLiterals++ = 2 * pVars[b] + 1;
        else
            nLits--;
        Cube >>= 2;
    }
    return nLits;
}